

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::InsertOrLookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,MapValueRef *val)

{
  bool bVar1;
  Descriptor *this_00;
  FieldDescriptor *pFVar2;
  MapFieldBase *this_01;
  
  if (field->type_ == '\v') {
    bVar1 = FieldDescriptor::is_map_message_type(field);
    if (bVar1) {
      this_00 = FieldDescriptor::message_type(field);
      pFVar2 = Descriptor::map_value(this_00);
      (val->super_MapValueConstRef).type_ =
           *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar2->type_ * 4);
      this_01 = (MapFieldBase *)MutableRawImpl(this,message,field);
      bVar1 = internal::MapFieldBase::InsertOrLookupMapValue(this_01,key,val);
      return bVar1;
    }
  }
  anon_unknown_6::ReportReflectionUsageError
            (this->descriptor_,field,"InsertOrLookupMapValue","Field is not a map field.");
}

Assistant:

bool Reflection::InsertOrLookupMapValue(Message* message,
                                        const FieldDescriptor* field,
                                        const MapKey& key,
                                        MapValueRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), InsertOrLookupMapValue,
              "Field is not a map field.");
  val->SetType(field->message_type()->map_value()->cpp_type());
  return MutableRaw<MapFieldBase>(message, field)
      ->InsertOrLookupMapValue(key, val);
}